

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O2

int IPdr_ManRestoreClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses,Vec_Int_t *vMap)

{
  uint Lit;
  int *piVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if (vClauses == (Vec_Vec_t *)0x0) {
    __assert_fail("vClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0x156,"int IPdr_ManRestoreClauses(Pdr_Man_t *, Vec_Vec_t *, Vec_Int_t *)");
  }
  Vec_VecFree(p->vClauses);
  p->vClauses = vClauses;
  if (vMap != (Vec_Int_t *)0x0) {
    for (iVar6 = 0; iVar6 < vClauses->nSize; iVar6 = iVar6 + 1) {
      iVar7 = 0;
      while( true ) {
        pVVar4 = Vec_VecEntry(vClauses,iVar6);
        if (pVVar4->nSize <= iVar7) break;
        pVVar4 = Vec_VecEntry(vClauses,iVar6);
        pvVar5 = Vec_PtrEntry(pVVar4,iVar7);
        for (lVar8 = 0; lVar8 < *(int *)((long)pvVar5 + 0x10); lVar8 = lVar8 + 1) {
          Lit = *(uint *)((long)pvVar5 + lVar8 * 4 + 0x14);
          if ((int)Lit < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x134,"int Abc_Lit2LitV(int *, int)");
          }
          piVar1 = vMap->pArray;
          uVar2 = Abc_Lit2Var(Lit);
          iVar3 = Abc_Var2Lit(piVar1[uVar2],Lit & 1);
          *(int *)((long)pvVar5 + lVar8 * 4 + 0x14) = iVar3;
        }
        iVar7 = iVar7 + 1;
      }
    }
  }
  for (iVar6 = 0; iVar7 = p->vClauses->nSize, iVar6 < iVar7; iVar6 = iVar6 + 1) {
    IPdr_ManSetSolver(p,iVar6,(uint)(iVar6 < iVar7 + -1));
  }
  return 0;
}

Assistant:

int IPdr_ManRestoreClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses, Vec_Int_t * vMap )
{
    int i;

    assert(vClauses);

    Vec_VecFree(p->vClauses);
    p->vClauses = vClauses;

    // remap clause literals using mapping (old flop -> new flop) found in array vMap
    if ( vMap )
    {
        Pdr_Set_t * pSet; int j, k;   
        Vec_VecForEachEntry( Pdr_Set_t *, vClauses, pSet, i, j )
            for ( k = 0; k < pSet->nLits; k++ )
                pSet->Lits[k] = Abc_Lit2LitV( Vec_IntArray(vMap), pSet->Lits[k] );
    }

    for ( i = 0; i < Vec_VecSize(p->vClauses); ++i )
        IPdr_ManSetSolver( p, i, i < Vec_VecSize( p->vClauses ) - 1 );

    return 0;
}